

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O0

void __thiscall diffusion::FileReader::FileReader(FileReader *this,string *file_name)

{
  bool bVar1;
  ErrorDataCorruption *this_00;
  exception *e;
  string *file_name_local;
  FileReader *this_local;
  
  Reader::Reader(&this->super_Reader);
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_00112bb8;
  std::ifstream::ifstream(&this->file_);
  std::
  deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::deque(&this->data_queue_);
  std::ifstream::open(&this->file_,file_name,8);
  bVar1 = is_file_valid(this);
  if (!bVar1) {
    this_00 = (ErrorDataCorruption *)__cxa_allocate_exception(0x10);
    ErrorDataCorruption::ErrorDataCorruption(this_00);
    __cxa_throw(this_00,&ErrorDataCorruption::typeinfo,ErrorDataCorruption::~ErrorDataCorruption);
  }
  return;
}

Assistant:

FileReader::FileReader(std::string const & file_name) {
    try {
        file_.open(file_name);
    } catch (std::exception const & e) {
        throw ErrorFileOpening();
    }
    if (!this->is_file_valid()) {
        throw ErrorDataCorruption();
    }
}